

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * CLI::clean_name_string(string *name,string *keyChars)

{
  char *pcVar1;
  pointer pcVar2;
  size_type sVar3;
  void *pvVar4;
  char cVar5;
  size_type sVar6;
  string *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_first_of(name,(keyChars->_M_dataplus)._M_p,0,keyChars->_M_string_length);
  if ((sVar3 == 0xffffffffffffffff) &&
     (((pcVar1 = (name->_M_dataplus)._M_p, *pcVar1 != '[' ||
       (pcVar1[name->_M_string_length - 1] != ']')) &&
      (sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               find_first_of(name,"\'`\"\\",0,4), sVar3 == 0xffffffffffffffff)))) {
    return name;
  }
  if ((name->_M_string_length == 0) ||
     (pcVar2 = (name->_M_dataplus)._M_p, pvVar4 = memchr(pcVar2,0x27,name->_M_string_length),
     pvVar4 == (void *)0x0 || (long)pvVar4 - (long)pcVar2 == -1)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
              (name,0,1,'\'');
    cVar5 = '\'';
  }
  else {
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_first_of(name,detail::escapedChars_abi_cxx11_,0,DAT_004f53b8);
    if (sVar3 != 0xffffffffffffffff) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
                (&local_50,name->_M_string_length + 4);
      sVar3 = name->_M_string_length;
      if (sVar3 != 0) {
        pcVar2 = (name->_M_dataplus)._M_p;
        sVar6 = 0;
        do {
          pcVar1 = detail::escapedChars_abi_cxx11_;
          cVar5 = pcVar2[sVar6];
          if (DAT_004f53b8 != 0) {
            pvVar4 = memchr(detail::escapedChars_abi_cxx11_,(int)cVar5,DAT_004f53b8);
            if ((long)pvVar4 - (long)pcVar1 != -1 && pvVar4 != (void *)0x0) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              push_back(&local_50,'\\');
              cVar5 = *(char *)(detail::escapedCharsCode_abi_cxx11_ + ((long)pvVar4 - (long)pcVar1))
              ;
            }
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (&local_50,cVar5);
          sVar6 = sVar6 + 1;
        } while (sVar3 != sVar6);
      }
      clean_name_string();
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
              (name,0,1,'\"');
    cVar5 = '\"';
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (name,cVar5);
  return name;
}

Assistant:

CLI11_INLINE std::string &clean_name_string(std::string &name, const std::string &keyChars) {
    if(name.find_first_of(keyChars) != std::string::npos || (name.front() == '[' && name.back() == ']') ||
       (name.find_first_of("'`\"\\") != std::string::npos)) {
        if(name.find_first_of('\'') == std::string::npos) {
            name.insert(0, 1, '\'');
            name.push_back('\'');
        } else {
            if(detail::has_escapable_character(name)) {
                name = detail::add_escaped_characters(name);
            }
            name.insert(0, 1, '\"');
            name.push_back('\"');
        }
    }
    return name;
}